

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O3

void __thiscall Pl_Flate::~Pl_Flate(Pl_Flate *this)

{
  ~Pl_Flate(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_Flate::~Pl_Flate() = default;